

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_xor(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  long lVar1;
  int iVar2;
  roaring64_bitmap_t *r;
  int *c;
  leaf_t lVar3;
  container_t *pcVar4;
  int *piVar5;
  bool bVar6;
  ulong uVar7;
  uint8_t uVar8;
  ulong uVar9;
  art_iterator_t *iterator;
  bool bVar10;
  bool bVar11;
  uint8_t result_typecode;
  art_iterator_t it2;
  art_iterator_t it1;
  uint8_t local_159;
  roaring64_bitmap_t *local_158;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  r = (roaring64_bitmap_t *)roaring_malloc(0xb8);
  art_init_cleared((art_t *)r);
  r->flags = '\0';
  r->first_free = 0;
  r->capacity = 0;
  r->containers = (container_t **)0x0;
  art_init_iterator(&local_c0,&r1->art,true);
  local_158 = r2;
  art_init_iterator(&local_150,&r2->art,true);
LAB_001084c0:
  do {
    bVar6 = local_c0.value == (ulong *)0x0;
    bVar10 = local_150.value != (ulong *)0x0;
    if (bVar6 && !bVar10) {
      return r;
    }
    iVar2 = 0;
    if (((!bVar6) && (bVar10)) && (iVar2 = art_compare_keys(local_c0.key,local_150.key), iVar2 == 0)
       ) {
      c = (int *)container_xor(r1->containers[*local_c0.value >> 8],(uint8_t)*local_c0.value,
                               local_158->containers[*local_150.value >> 8],
                               (uint8_t)*local_150.value,&local_159);
      piVar5 = c;
      uVar8 = local_159;
      if (local_159 == '\x04') {
        uVar8 = (uint8_t)c[2];
        piVar5 = *(int **)c;
      }
      iVar2 = *piVar5;
      if ((uVar8 == '\x03') || (uVar8 == '\x02')) {
        bVar11 = 0 < iVar2;
      }
      else {
        if (iVar2 == -1) {
          if (**(long **)(piVar5 + 2) == 0) {
            uVar7 = 0xffffffffffffffff;
            do {
              if (uVar7 == 0x3fe) {
                uVar9 = 0x3ff;
                break;
              }
              uVar9 = uVar7 + 1;
              lVar1 = uVar7 + 2;
              uVar7 = uVar9;
            } while ((*(long **)(piVar5 + 2))[lVar1] == 0);
            bVar11 = 0x3fe < uVar9;
          }
          else {
            bVar11 = false;
          }
        }
        else {
          bVar11 = iVar2 == 0;
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      if (bVar11) {
        lVar3 = add_container(r,c,local_159);
        art_insert((art_t *)r,local_c0.key,lVar3);
      }
      else {
        container_free(c,local_159);
      }
      art_iterator_next(&local_c0);
      art_iterator_next(&local_150);
      iVar2 = 0;
    }
    if (!bVar6) {
      if (bVar10 && -1 < iVar2) goto LAB_00108668;
LAB_00108617:
      local_159 = (uint8_t)*local_c0.value;
      pcVar4 = get_copy_of_container(r1->containers[*local_c0.value >> 8],&local_159,false);
      lVar3 = add_container(r,pcVar4,local_159);
      art_insert((art_t *)r,local_c0.key,lVar3);
      iterator = &local_c0;
      goto LAB_001086ce;
    }
    if (iVar2 < 0) goto LAB_00108617;
LAB_00108668:
    if (!bVar6) break;
    if (bVar10 || 0 < iVar2) goto LAB_00108681;
  } while( true );
  if (0 < iVar2) {
LAB_00108681:
    local_159 = (uint8_t)*local_150.value;
    pcVar4 = get_copy_of_container(local_158->containers[*local_150.value >> 8],&local_159,false);
    lVar3 = add_container(r,pcVar4,local_159);
    art_insert((art_t *)r,local_150.key,lVar3);
    iterator = &local_150;
LAB_001086ce:
    art_iterator_next(iterator);
  }
  goto LAB_001084c0;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_xor(const roaring64_bitmap_t *r1,
                                         const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 ^ it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t leaf1 = (leaf_t)*it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container =
                    container_xor(get_container(r1, leaf1), get_typecode(leaf1),
                                  get_container(r2, leaf2), get_typecode(leaf2),
                                  &result_typecode);
                if (container_nonzero_cardinality(result_container,
                                                  result_typecode)) {
                    leaf_t result_leaf = add_container(result, result_container,
                                                       result_typecode);
                    art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                } else {
                    container_free(result_container, result_typecode);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, result, (leaf_t)*it2.value);
            art_insert(&result->art, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}